

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall QMakeEvaluator::checkRequirements(QMakeEvaluator *this,ProStringList *deps)

{
  ProFile *pPVar1;
  CutResult CVar2;
  VisitReturn VVar3;
  QList<ProString> *this_00;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  ProString *dep;
  ProString *args;
  long in_FS_OFFSET;
  QStringView cond;
  ProKey local_70;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey(&local_70,"QMAKE_FAILED_REQUIREMENTS");
  this_00 = &valuesRef(this,&local_70)->super_QList<ProString>;
  if (&(local_70.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar6 = (deps->super_QList<ProString>).d.size;
  VVar3 = ReturnTrue;
  if (lVar6 != 0) {
    args = (deps->super_QList<ProString>).d.ptr;
    lVar6 = lVar6 * 0x30;
    do {
      pcVar4 = (args->m_string).d.ptr;
      local_70.super_ProString.m_string.d.d = (Data *)(long)args->m_offset;
      local_40 = (long)args->m_length;
      CVar2 = QtPrivate::QContainerImplHelper::mid
                        ((args->m_string).d.size,(qsizetype *)&local_70,&local_40);
      if (CVar2 == Null) {
        lVar5 = 0;
        pcVar4 = (char16_t *)0x0;
      }
      else {
        pcVar4 = pcVar4 + (long)local_70.super_ProString.m_string.d.d;
        lVar5 = local_40;
      }
      pPVar1 = (this->m_current).pro;
      local_70.super_ProString.m_string.d.d = (pPVar1->m_fileName).d.d;
      local_70.super_ProString.m_string.d.ptr = (pPVar1->m_fileName).d.ptr;
      local_70.super_ProString.m_string.d.size = (pPVar1->m_fileName).d.size;
      if (&(local_70.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_)->ref_).
        _q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_)->
             ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      cond.m_data = pcVar4;
      cond.m_size = lVar5;
      VVar3 = evaluateConditional(this,cond,(QString *)&local_70,(uint)(this->m_current).line);
      if (&(local_70.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (VVar3 != ReturnTrue) {
        if (VVar3 == ReturnError) goto LAB_0027d277;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,args);
        QList<ProString>::end(this_00);
      }
      args = args + 1;
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != 0);
    VVar3 = ReturnTrue;
  }
LAB_0027d277:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::checkRequirements(const ProStringList &deps)
{
    ProStringList &failed = valuesRef(ProKey("QMAKE_FAILED_REQUIREMENTS"));
    for (const ProString &dep : deps) {
        VisitReturn vr = evaluateConditional(dep.toQStringView(), m_current.pro->fileName(), m_current.line);
        if (vr == ReturnError)
            return ReturnError;
        if (vr != ReturnTrue)
            failed << dep;
    }
    return ReturnTrue;
}